

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIEditBox::updateAbsolutePosition(CGUIEditBox *this)

{
  bool bVar1;
  rect<int> oldAbsoluteRect;
  rect<int> local_28;
  
  local_28.UpperLeftCorner.X = *(int *)&this->field_0x40;
  local_28.UpperLeftCorner.Y = *(int *)&this->field_0x44;
  local_28.LowerRightCorner.X = *(int *)&this->field_0x48;
  local_28.LowerRightCorner.Y = *(int *)&this->field_0x4c;
  IGUIElement::updateAbsolutePosition((IGUIElement *)this);
  bVar1 = core::rect<int>::operator!=(&local_28,(rect<int> *)&this->field_0x40);
  if (bVar1) {
    calculateFrameRect(this);
    breakText(this);
    calculateScrollPos(this);
  }
  return;
}

Assistant:

void CGUIEditBox::updateAbsolutePosition()
{
	core::rect<s32> oldAbsoluteRect(AbsoluteRect);
	IGUIElement::updateAbsolutePosition();
	if (oldAbsoluteRect != AbsoluteRect) {
		calculateFrameRect();
		breakText();
		calculateScrollPos();
	}
}